

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,char *root_filename)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  uint uVar6;
  FILE *pFVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  double *pdVar15;
  undefined8 uVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  REF_INT RVar23;
  ulong uVar24;
  uint uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  REF_INT nnode;
  REF_INT *g2l;
  REF_INT nface;
  REF_INT *l2g;
  REF_INT nodes [27];
  REF_DBL d [12];
  REF_DBL m [6];
  REF_DBL m_1 [6];
  char viz_file [256];
  REF_STATUS local_34c;
  uint local_348;
  uint local_30c;
  ulong local_308;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  void *local_2e8;
  REF_DICT local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  REF_INT *local_2c8;
  uint local_2bc;
  REF_INT *local_2b8;
  void *local_2b0;
  uint local_2a8 [28];
  REF_DBL local_238 [3];
  double adStack_220 [11];
  REF_DBL local_1c8 [5];
  double local_1a0 [7];
  REF_DBL local_168 [6];
  char local_138 [264];
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->cell[3];
  if (ref_grid->twod == 0) {
    snprintf(local_138,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
             (ulong)(uint)ref_grid->mpi->id);
    pFVar7 = fopen(local_138,"w");
    if (pFVar7 == (FILE *)0x0) {
      printf("unable to open %s\n",local_138);
      pcVar19 = "unable to open file";
      uVar16 = 0x39a;
      goto LAB_00115a60;
    }
    fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,pFVar7);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar7);
    if ((long)pRVar1->max < 0) {
      local_34c = 1;
      pcVar19 = "malloc o2n of REF_INT negative";
LAB_0011608a:
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x39f,"ref_export_tec_metric_ellipse",pcVar19);
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)pRVar1->max << 2);
      if (pvVar8 == (void *)0x0) {
        local_34c = 2;
        pcVar19 = "malloc o2n of REF_INT NULL";
        goto LAB_0011608a;
      }
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar9 = 0;
        do {
          *(undefined4 *)((long)pvVar8 + lVar9 * 4) = 0xffffffff;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pRVar1->max);
      }
    }
    if (!bVar4) {
      return local_34c;
    }
    if (pRVar2->max < 1) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = (void *)0x0;
      iVar17 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar2,iVar17,(REF_INT *)local_2a8);
        if ((RVar5 == 0) && (0 < pRVar2->node_per)) {
          lVar9 = 0;
          do {
            if (*(int *)((long)pvVar8 + (long)(int)local_2a8[lVar9] * 4) == -1) {
              *(int *)((long)pvVar8 + (long)(int)local_2a8[lVar9] * 4) = (int)pvVar11;
              pvVar11 = (void *)(ulong)((int)pvVar11 + 1);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < pRVar2->node_per);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < pRVar2->max);
    }
    if ((int)pvVar11 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x3aa,"ref_export_tec_metric_ellipse","malloc n2o of REF_INT negative");
      return 1;
    }
    local_300 = pvVar11;
    local_2f0 = malloc((long)pvVar11 << 2);
    pvVar11 = local_300;
    if (local_2f0 != (void *)0x0) {
      iVar17 = pRVar1->max;
      if (0 < (long)iVar17) {
        lVar9 = 0;
        do {
          lVar12 = (long)*(int *)((long)pvVar8 + lVar9 * 4);
          if (lVar12 != -1) {
            *(int *)((long)local_2f0 + lVar12 * 4) = (int)lVar9;
          }
          lVar9 = lVar9 + 1;
        } while (iVar17 != lVar9);
      }
      iVar17 = (int)local_300;
      fprintf(pFVar7,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)(iVar17 * 0x6c),(ulong)(uint)(iVar17 * 0x6c),"point","felineseg");
      local_2b0 = pvVar8;
      if (iVar17 != 0) {
        local_2f8 = (void *)0x1;
        if (1 < iVar17) {
          local_2f8 = (void *)((ulong)pvVar11 & 0xffffffff);
        }
        pvVar8 = (void *)0x0;
        do {
          RVar23 = *(REF_INT *)((long)local_2f0 + (long)pvVar8 * 4);
          local_2e8 = pvVar8;
          uVar6 = ref_node_metric_get(pRVar1,RVar23,local_1c8);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x3b9,"ref_export_tec_metric_ellipse",(ulong)uVar6,"get");
            return uVar6;
          }
          uVar6 = ref_matrix_diag_m(local_1c8,local_238);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x3ba,"ref_export_tec_metric_ellipse",(ulong)uVar6,"diag");
            return uVar6;
          }
          uVar6 = ref_matrix_descending_eig(local_238);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x3bb,"ref_export_tec_metric_ellipse",(ulong)uVar6,"sort eig");
            return uVar6;
          }
          lVar9 = (long)RVar23;
          uVar24 = 0;
          do {
            local_2d8 = uVar24 + 1;
            uVar13 = local_2d8 & 0xffffffff;
            if (local_2d8 == 3) {
              uVar13 = 0;
            }
            local_2d0 = uVar13 * 3 + 3 & 0xffffffff;
            dVar26 = 0.0;
            iVar17 = 0x24;
            local_308 = uVar24;
            do {
              dVar27 = cos(dVar26 * 0.17453292519943278);
              dVar28 = local_238[local_308];
              if (dVar28 < 0.0) {
                dVar28 = sqrt(dVar28);
              }
              else {
                dVar28 = SQRT(dVar28);
              }
              dVar29 = sin(dVar26 * 0.17453292519943278);
              dVar30 = local_238[uVar13];
              if (dVar30 < 0.0) {
                dVar30 = sqrt(dVar30);
              }
              else {
                dVar30 = SQRT(dVar30);
              }
              dVar30 = (dVar29 * 0.5) / dVar30;
              dVar28 = (dVar27 * 0.5) / dVar28;
              pRVar3 = pRVar1->real;
              fprintf(pFVar7," %.16e %.16e %.16e\n",
                      adStack_220[uVar24 * 3] * dVar28 + local_238[local_2d0] * dVar30 +
                      pRVar3[lVar9 * 0xf],
                      adStack_220[uVar24 * 3 + 1] * dVar28 + local_238[(int)uVar13 * 3 + 4] * dVar30
                      + pRVar3[lVar9 * 0xf + 1],
                      dVar28 * adStack_220[uVar24 * 3 + 2] + dVar30 * local_238[(int)uVar13 * 3 + 5]
                      + pRVar3[lVar9 * 0xf + 2]);
              dVar26 = dVar26 + 1.0;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
            uVar24 = local_2d8;
          } while (local_2d8 != 3);
          pvVar8 = (void *)((long)local_2e8 + 1);
        } while (pvVar8 != local_2f8);
      }
      iVar17 = (int)local_300;
      iVar14 = 1;
      if (1 < iVar17) {
        iVar14 = iVar17;
      }
      local_308 = CONCAT44(local_308._4_4_,iVar17 * 0x24);
      local_348 = 2;
      iVar17 = 0;
      do {
        if ((int)local_300 != 0) {
          uVar22 = iVar17 * (int)local_308;
          iVar21 = 0;
          uVar6 = local_348;
          do {
            iVar20 = 0x23;
            uVar25 = uVar6;
            do {
              fprintf(pFVar7," %d %d\n",(ulong)(uVar25 - 1),(ulong)uVar25);
              uVar25 = uVar25 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
            fprintf(pFVar7," %d %d\n",(ulong)(uVar22 + 0x24 + iVar21 * 0x24),
                    (ulong)(iVar21 * 0x24 + (uVar22 | 1)));
            iVar21 = iVar21 + 1;
            uVar6 = uVar6 + 0x24;
          } while (iVar21 != iVar14);
        }
        iVar17 = iVar17 + 1;
        local_348 = local_348 + (int)local_308;
      } while (iVar17 != 3);
      free(local_2f0);
      if (local_2b0 != (void *)0x0) {
        free(local_2b0);
      }
      uVar6 = ref_export_tec_surf_zone(ref_grid,(FILE *)pFVar7);
      if (uVar6 == 0) {
        fclose(pFVar7);
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x3d9,"ref_export_tec_metric_ellipse",(ulong)uVar6,"ellipse surf");
      return uVar6;
    }
    pcVar19 = "malloc n2o of REF_INT NULL";
    uVar16 = 0x3aa;
LAB_00115a60:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar16
           ,"ref_export_tec_metric_ellipse",pcVar19);
    return 2;
  }
  snprintf(local_138,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
           (ulong)(uint)ref_grid->mpi->id);
  pFVar7 = fopen(local_138,"w");
  if (pFVar7 == (FILE *)0x0) {
    printf("unable to open %s\n",local_138);
    pcVar19 = "unable to open file";
    uVar16 = 0x334;
LAB_00115a09:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar16
           ,"ref_export_tec_metric_ellipse_twod",pcVar19);
    uVar24 = 2;
    goto LAB_00116043;
  }
  fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,pFVar7);
  fwrite("variables = \"x\" \"y\"\n",0x14,1,pFVar7);
  iVar17 = pRVar1->max;
  uVar24 = (ulong)iVar17;
  if ((long)uVar24 < 0) {
    uVar24 = 1;
    pcVar19 = "malloc o2n of REF_INT negative";
LAB_00115a7e:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x339,
           "ref_export_tec_metric_ellipse_twod",pcVar19);
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc(uVar24 * 4);
    if (pvVar8 == (void *)0x0) {
      uVar24 = 2;
      pcVar19 = "malloc o2n of REF_INT NULL";
      goto LAB_00115a7e;
    }
    bVar4 = true;
    if (iVar17 != 0) {
      lVar9 = 0;
      do {
        *(undefined4 *)((long)pvVar8 + lVar9 * 4) = 0xffffffff;
        lVar9 = lVar9 + 1;
      } while (lVar9 < pRVar1->max);
    }
  }
  if (!bVar4) {
    uVar24 = uVar24 & 0xffffffff;
    goto LAB_00116043;
  }
  if (pRVar2->max < 1) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (void *)0x0;
    iVar17 = 0;
    do {
      RVar5 = ref_cell_nodes(pRVar2,iVar17,(REF_INT *)local_238);
      if ((RVar5 == 0) && (0 < pRVar2->node_per)) {
        lVar9 = 0;
        do {
          lVar12 = (long)*(int *)((long)local_238 + lVar9 * 4);
          if (*(int *)((long)pvVar8 + lVar12 * 4) == -1) {
            *(int *)((long)pvVar8 + lVar12 * 4) = (int)pvVar11;
            pvVar11 = (void *)(ulong)((int)pvVar11 + 1);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pRVar2->node_per);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < pRVar2->max);
  }
  iVar17 = (int)pvVar11;
  if (iVar17 < 0) {
    pcVar19 = "malloc n2o of REF_INT negative";
    uVar16 = 0x344;
LAB_00116037:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar16
           ,"ref_export_tec_metric_ellipse_twod",pcVar19);
    uVar24 = 1;
    goto LAB_00116043;
  }
  pvVar10 = malloc((long)pvVar11 << 2);
  if (pvVar10 == (void *)0x0) {
    pcVar19 = "malloc n2o of REF_INT NULL";
    uVar16 = 0x344;
    goto LAB_00115a09;
  }
  iVar14 = pRVar1->max;
  if (0 < (long)iVar14) {
    lVar9 = 0;
    do {
      lVar12 = (long)*(int *)((long)pvVar8 + lVar9 * 4);
      if (lVar12 != -1) {
        *(int *)((long)pvVar10 + lVar12 * 4) = (int)lVar9;
      }
      lVar9 = lVar9 + 1;
    } while (iVar14 != lVar9);
  }
  local_2f8 = pvVar11;
  fprintf(pFVar7,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
          (ulong)(uint)(iVar17 * 0xc),(ulong)(uint)(iVar17 * 0xc),"point","felineseg");
  local_2e8 = pvVar10;
  if (iVar17 != 0) {
    local_2f0 = (void *)0x1;
    if (1 < iVar17) {
      local_2f0 = pvVar11;
    }
    pvVar11 = (void *)0x0;
    do {
      RVar23 = *(REF_INT *)((long)local_2e8 + (long)pvVar11 * 4);
      local_300 = pvVar11;
      uVar6 = ref_node_metric_get(pRVar1,RVar23,local_168);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x353,"ref_export_tec_metric_ellipse_twod",(ulong)uVar6,"get");
        uVar24 = (ulong)uVar6;
        goto LAB_00116043;
      }
      uVar6 = ref_matrix_diag_m(local_168,local_1c8);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x354,"ref_export_tec_metric_ellipse_twod",(ulong)uVar6,"diag");
        uVar24 = (ulong)uVar6;
        goto LAB_00116043;
      }
      uVar6 = ref_matrix_descending_eig(local_1c8);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x355,"ref_export_tec_metric_ellipse_twod",(ulong)uVar6,"sort eig");
        uVar24 = (ulong)uVar6;
        goto LAB_00116043;
      }
      uVar13 = 0xffffffff;
      pdVar15 = local_1a0;
      uVar18 = 0;
      dVar26 = -1.0;
      do {
        dVar28 = *pdVar15;
        if (dVar28 <= -dVar28) {
          dVar28 = -dVar28;
        }
        if (dVar26 < dVar28) {
          uVar13 = uVar18 & 0xffffffff;
          dVar26 = dVar28;
        }
        uVar18 = uVar18 + 1;
        pdVar15 = pdVar15 + 3;
      } while (uVar18 != 3);
      iVar17 = (int)uVar13;
      if (iVar17 == -1) {
        pcVar19 = "couldn\'t find best y";
        uVar16 = 0x35e;
        goto LAB_00116037;
      }
      iVar14 = (uint)(iVar17 < 2) * 3 + iVar17 + -2;
      iVar17 = iVar17 + -1 + (uint)(iVar17 < 1) * 3;
      local_308 = (ulong)iVar14;
      local_2d0 = (ulong)(iVar14 * 3 + 3);
      local_2d8 = (ulong)(iVar17 * 3 + 3);
      dVar26 = 0.0;
      iVar21 = 0xc;
      do {
        dVar27 = cos(dVar26 * 0.5235987755982983);
        dVar28 = local_1c8[local_308];
        if (dVar28 < 0.0) {
          dVar28 = sqrt(dVar28);
        }
        else {
          dVar28 = SQRT(dVar28);
        }
        dVar29 = sin(dVar26 * 0.5235987755982983);
        dVar30 = local_1c8[iVar17];
        if (dVar30 < 0.0) {
          dVar30 = sqrt(dVar30);
        }
        else {
          dVar30 = SQRT(dVar30);
        }
        dVar30 = (dVar29 * 0.5) / dVar30;
        dVar28 = (dVar27 * 0.5) / dVar28;
        fprintf(pFVar7," %.16e %.16e\n",
                local_1c8[local_2d0] * dVar28 + local_1c8[local_2d8] * dVar30 +
                pRVar1->real[(long)RVar23 * 0xf],
                dVar28 * local_1c8[iVar14 * 3 + 4] + dVar30 * local_1c8[iVar17 * 3 + 4] +
                pRVar1->real[(long)RVar23 * 0xf + 1]);
        dVar26 = dVar26 + 1.0;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
      pvVar11 = (void *)((long)local_300 + 1);
    } while (pvVar11 != local_2f0);
  }
  iVar17 = (int)local_2f8;
  if (iVar17 != 0) {
    iVar14 = 1;
    if (1 < iVar17) {
      iVar14 = iVar17;
    }
    uVar6 = 2;
    iVar17 = 0;
    do {
      iVar21 = 0xb;
      uVar22 = uVar6;
      do {
        fprintf(pFVar7," %d %d\n",(ulong)(uVar22 - 1),(ulong)uVar22);
        uVar22 = uVar22 + 1;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
      fprintf(pFVar7," %d %d\n",(ulong)(iVar17 * 0xc + 0xc),iVar17 * 0xc + 1);
      iVar17 = iVar17 + 1;
      uVar6 = uVar6 + 0xc;
    } while (iVar17 != iVar14);
  }
  free(local_2e8);
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  pRVar1 = ref_grid->node;
  uVar6 = ref_dict_create(&local_2e0);
  if (uVar6 == 0) {
    pRVar2 = ref_grid->cell[3];
    if (0 < pRVar2->max) {
      RVar23 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar2,RVar23,(REF_INT *)local_2a8);
        if ((RVar5 == 0) &&
           (uVar6 = ref_dict_store(local_2e0,local_2a8[pRVar2->node_per],-1), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x268,"ref_export_tec_twod_zone",(ulong)uVar6,"mark tri");
          goto LAB_00115fcc;
        }
        RVar23 = RVar23 + 1;
      } while (RVar23 < pRVar2->max);
    }
    pRVar2 = ref_grid->cell[6];
    if (0 < pRVar2->max) {
      iVar17 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar2,iVar17,(REF_INT *)local_2a8);
        if ((RVar5 == 0) &&
           (uVar6 = ref_dict_store(local_2e0,local_2a8[pRVar2->node_per],-1), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x26d,"ref_export_tec_twod_zone",(ulong)uVar6,"mark qua");
          goto LAB_00115fcc;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < pRVar2->max);
    }
    if (local_2e0->n < 1) {
LAB_00116a6c:
      uVar6 = ref_dict_free(local_2e0);
      if (uVar6 != 0) {
        pcVar19 = "free dict";
        uVar16 = 0x295;
        goto LAB_00115fc2;
      }
      uVar6 = 0;
    }
    else {
      uVar22 = *local_2e0->key;
      lVar9 = 0;
      while (uVar6 = ref_grid_tri_qua_id_nodes
                               (ref_grid,uVar22,(REF_INT *)&local_30c,(REF_INT *)&local_2bc,
                                &local_2c8,&local_2b8), uVar6 == 0) {
        fprintf(pFVar7,"zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)uVar22,(ulong)local_30c,(ulong)local_2bc,"point","fequadrilateral");
        if (0 < (int)local_30c) {
          lVar12 = 0;
          do {
            pRVar3 = pRVar1->real;
            fprintf(pFVar7," %.16e %.16e\n",pRVar3[(long)local_2b8[lVar12] * 0xf],
                    pRVar3[(long)local_2b8[lVar12] * 0xf + 1]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)local_30c);
        }
        pRVar2 = ref_grid->cell[3];
        if (0 < pRVar2->max) {
          RVar23 = 0;
          do {
            RVar5 = ref_cell_nodes(pRVar2,RVar23,(REF_INT *)local_2a8);
            if ((RVar5 == 0) && (uVar22 == local_2a8[pRVar2->node_per])) {
              local_2a8[3] = local_2a8[2];
              lVar12 = 0;
              do {
                fprintf(pFVar7," %d",(ulong)(local_2c8[(int)local_2a8[lVar12]] + 1));
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              fputc(10,pFVar7);
            }
            RVar23 = RVar23 + 1;
          } while (RVar23 < pRVar2->max);
        }
        pRVar2 = ref_grid->cell[6];
        if (0 < pRVar2->max) {
          iVar17 = 0;
          do {
            RVar5 = ref_cell_nodes(pRVar2,iVar17,(REF_INT *)local_2a8);
            if ((RVar5 == 0) && (uVar22 == local_2a8[pRVar2->node_per])) {
              lVar12 = 0;
              do {
                fprintf(pFVar7," %d",(ulong)(local_2c8[(int)local_2a8[lVar12]] + 1));
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              fputc(10,pFVar7);
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 < pRVar2->max);
        }
        if (local_2b8 != (REF_INT *)0x0) {
          free(local_2b8);
        }
        if (local_2c8 != (REF_INT *)0x0) {
          free(local_2c8);
        }
        lVar9 = lVar9 + 1;
        if (local_2e0->n <= lVar9) goto LAB_00116a6c;
        uVar22 = local_2e0->key[lVar9];
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x272,"ref_export_tec_twod_zone",(ulong)uVar6,"extract this boundary");
    }
  }
  else {
    pcVar19 = "create dict";
    uVar16 = 0x263;
LAB_00115fc2:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar16
           ,"ref_export_tec_twod_zone",(ulong)uVar6,pcVar19);
  }
LAB_00115fcc:
  uVar22 = (uint)uVar24;
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x377,
           "ref_export_tec_metric_ellipse_twod",(ulong)uVar6,"ellipse surf");
    uVar22 = uVar6;
  }
  uVar24 = (ulong)uVar22;
  if (uVar6 == 0) {
    fclose(pFVar7);
    uVar24 = 0;
  }
LAB_00116043:
  if ((int)uVar24 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x390,
           "ref_export_tec_metric_ellipse",uVar24,"2d met");
  }
  return (int)uVar24;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,
                                                 const char *root_filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nnode, node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], d[12];
  REF_DBL x, y, z;
  REF_DBL ex, ey;
  FILE *file;
  char viz_file[256];
  REF_INT i, n = 36;
  REF_INT e0, e1;
  REF_DBL dt = ref_math_in_radians(360.0 / (REF_DBL)n);
  REF_DBL scale = 0.5; /* so the ellipses touch for an ideal grid */

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_export_tec_metric_ellipse_twod(ref_grid, root_filename), "2d met");
    return REF_SUCCESS;
  }

  snprintf(viz_file, 256, "%s_n%d_p%d_ellipse.tec", root_filename,
           ref_mpi_n(ref_grid_mpi(ref_grid)),
           ref_mpi_rank(ref_grid_mpi(ref_grid)));

  file = fopen(viz_file, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", viz_file);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine metric axes\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  nnode = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }
    }
  }

  ref_malloc(n2o, nnode, REF_INT);
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != o2n[node]) {
      n2o[o2n[node]] = node;
    }
  }

  ncell = nnode * n;

  fprintf(file,
          "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          3 * ncell, 3 * ncell, "point", "felineseg");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_metric_get(ref_node, n2o[node], m), "get");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_descending_eig(d), "sort eig");
    for (e0 = 0; e0 < 3; e0++) {
      e1 = e0 + 1;
      if (e1 == 3) e1 = 0;
      for (i = 0; i < n; i++) {
        ex = scale * cos(i * dt) / sqrt(d[e0]);
        ey = scale * sin(i * dt) / sqrt(d[e1]);
        x = d[3 + 3 * e0] * ex + d[3 + 3 * e1] * ey;
        y = d[4 + 3 * e0] * ex + d[4 + 3 * e1] * ey;
        z = d[5 + 3 * e0] * ex + d[5 + 3 * e1] * ey;
        fprintf(file, " %.16e %.16e %.16e\n",
                ref_node_xyz(ref_node, 0, n2o[node]) + x,
                ref_node_xyz(ref_node, 1, n2o[node]) + y,
                ref_node_xyz(ref_node, 2, n2o[node]) + z);
      }
    }
  }

  for (e0 = 0; e0 < 3; e0++)
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < n - 1; i++)
        fprintf(file, " %d %d\n", i + node * n + 1 + ncell * e0,
                i + 1 + node * n + 1 + ncell * e0);
      fprintf(file, " %d %d\n", n + node * n + ncell * e0,
              1 + node * n + ncell * e0);
    }

  ref_free(n2o);
  ref_free(o2n);

  RSS(ref_export_tec_surf_zone(ref_grid, file), "ellipse surf");

  fclose(file);

  return REF_SUCCESS;
}